

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void ConvertToMConcatNode(Col_Word *nodePtr)

{
  uint local_34;
  uint local_30;
  uint local_2c;
  Col_Word local_28;
  Col_Word right;
  Col_Word left;
  Col_Word converted;
  Col_Word *nodePtr_local;
  
  if (*nodePtr == 0) {
    local_2c = 0;
  }
  else {
    if ((*nodePtr & 0xf) == 0) {
      if ((*(byte *)*nodePtr & 2) == 0) {
        local_34 = 0xffffffff;
      }
      else {
        local_34 = *(byte *)*nodePtr & 0xfffffffe;
      }
      local_30 = local_34;
    }
    else {
      local_30 = immediateWordTypes[*nodePtr & 0x1f];
    }
    local_2c = local_30;
  }
  converted = (Col_Word)nodePtr;
  if (local_2c == 0x1e) {
    GetArms(*nodePtr,&right,&local_28);
    left = NewMConcatList(right,local_28);
  }
  else if (local_2c == 0x22) {
    left = NewMConcatList(*(Col_Word *)(*nodePtr + 0x10),*(Col_Word *)(*nodePtr + 0x18));
  }
  *(Col_Word *)converted = left;
  return;
}

Assistant:

static void
ConvertToMConcatNode(
    Col_Word *nodePtr)  /*!< [in,out] Mutable list node to convert. Gets
                             overwritten upon return. */
{
    Col_Word converted;

    switch (WORD_TYPE(*nodePtr)) {
    case WORD_TYPE_SUBLIST: {
        /*
         * Split sublist into mutable concat node.
         */

        Col_Word left, right;

        ASSERT(WORD_SUBLIST_DEPTH(*nodePtr) >= 1);
        ASSERT(WORD_TYPE(WORD_SUBLIST_SOURCE(*nodePtr)) == WORD_TYPE_CONCATLIST);

        GetArms(*nodePtr, &left, &right);

        converted = NewMConcatList(left, right);
        break;
        }

    case WORD_TYPE_CONCATLIST: {
        /*
         * Convert to mutable concat node.
         */

        ASSERT(WORD_CONCATLIST_DEPTH(*nodePtr) >= 1);

        converted = NewMConcatList(WORD_CONCATLIST_LEFT(*nodePtr),
                WORD_CONCATLIST_RIGHT(*nodePtr));
        break;
        }

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    *nodePtr = converted;
}